

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

int xmlSaveFileTo(xmlOutputBufferPtr buf,xmlDocPtr cur,char *encoding)

{
  int iVar1;
  xmlSaveCtxt ctxt;
  xmlSaveCtxt local_c0;
  
  iVar1 = -1;
  if (buf != (xmlOutputBufferPtr)0x0) {
    if (cur == (xmlDocPtr)0x0) {
      xmlOutputBufferClose(buf);
    }
    else {
      memset(&local_c0,0,0x98);
      local_c0.level = 0;
      local_c0.format = 0;
      local_c0.encoding = (xmlChar *)encoding;
      local_c0.buf = buf;
      xmlSaveCtxtInit(&local_c0);
      local_c0.options._0_1_ = (byte)local_c0.options | 0x20;
      xmlDocContentDumpOutput(&local_c0,cur);
      iVar1 = xmlOutputBufferClose(buf);
    }
  }
  return iVar1;
}

Assistant:

int
xmlSaveFileTo(xmlOutputBufferPtr buf, xmlDocPtr cur, const char *encoding) {
    xmlSaveCtxt ctxt;
    int ret;

    if (buf == NULL) return(-1);
    if (cur == NULL) {
        xmlOutputBufferClose(buf);
	return(-1);
    }
    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = buf;
    ctxt.level = 0;
    ctxt.format = 0;
    ctxt.encoding = (const xmlChar *) encoding;
    xmlSaveCtxtInit(&ctxt);
    ctxt.options |= XML_SAVE_AS_XML;
    xmlDocContentDumpOutput(&ctxt, cur);
    ret = xmlOutputBufferClose(buf);
    return(ret);
}